

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall
amrex::StateData::FillBoundary
          (StateData *this,Box *bx,FArrayBox *dest,Real time,Geometry *geom,int dest_comp,
          int src_comp,int num_comp)

{
  Box *this_00;
  StateDescriptor *this_01;
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  BCRec *pBVar4;
  ulong uVar5;
  BndryFunc *pBVar6;
  long lVar7;
  long lVar8;
  int *dlo;
  uint uVar9;
  IndexType IVar10;
  uint uVar11;
  undefined4 uVar12;
  int iVar13;
  undefined4 uVar15;
  int iVar16;
  int *bxlo;
  ulong uVar17;
  int iVar18;
  undefined4 uVar19;
  allocator_type local_99;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcr;
  IndexType IStack_80;
  ulong uVar14;
  
  uVar3 = (this->domain).btype.itype;
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)(bx->smallend).vect;
  uVar1 = *(undefined8 *)((bx->smallend).vect + 2);
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (undefined4)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  stack0xffffffffffffff7c = *(undefined8 *)((bx->bigend).vect + 2);
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = (undefined4)uVar1;
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    uVar9 = 1 << ((byte)lVar7 & 0x1f);
    uVar11 = (uint)lVar7;
    *(uint *)((long)&bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_finish + lVar7 * 4 + 4) =
         (*(int *)((long)&bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar7 * 4 + 4) +
         (uint)((uVar3 >> (uVar11 & 0x1f) & 1) != 0)) -
         (uint)((IStack_80.itype >> (uVar11 & 0x1f) & 1) != 0);
    if ((uVar3 >> (uVar11 & 0x1f) & 1) == 0) {
      IVar10.itype = ~uVar9 & IStack_80.itype;
    }
    else {
      IVar10.itype = uVar9 | IStack_80.itype;
    }
    IStack_80.itype = IVar10.itype;
  }
  this_00 = &this->domain;
  bVar2 = Box::contains(this_00,(Box *)&bcr);
  if (!bVar2) {
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bcr,(long)num_comp,&local_99)
    ;
    iVar18 = 0;
    while (iVar18 < num_comp) {
      uVar3 = iVar18 + dest_comp;
      uVar11 = iVar18 + src_comp;
      uVar14 = (ulong)uVar11;
      this_01 = this->desc;
      uVar19 = SUB84(time,0);
      if ((this_01->m_primary).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [(int)uVar11] == 0) {
        pBVar4 = StateDescriptor::getBC(this_01,uVar11);
        for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
          uVar12 = 0;
          uVar15 = 0;
          if (*(int *)((long)(bx->smallend).vect + lVar7) <=
              *(int *)((long)(this_00->smallend).vect + lVar7)) {
            uVar15 = *(undefined4 *)((long)pBVar4->bc + lVar7);
          }
          *(undefined4 *)
           ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_start)->bc + lVar7) = uVar15;
          if (*(int *)((long)(this->domain).bigend.vect + lVar7) <=
              *(int *)((long)(bx->bigend).vect + lVar7)) {
            uVar12 = *(undefined4 *)((long)pBVar4->bc + lVar7 + 0xc);
          }
          *(undefined4 *)
           ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_start)->bc + lVar7 + 0xc) = uVar12;
        }
        pBVar6 = StateDescriptor::bndryFill(this->desc,uVar11);
        (*pBVar6->_vptr_BndryFunc[5])(uVar19,pBVar6,bx,dest,(ulong)uVar3,1,geom,&bcr,0,uVar14);
        iVar18 = iVar18 + 1;
      }
      else {
        uVar9 = (this_01->m_groupsize).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[(int)uVar11];
        if (num_comp < (int)(uVar9 + iVar18)) {
          pBVar4 = StateDescriptor::getBC(this_01,uVar11);
          for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
            uVar12 = 0;
            uVar15 = 0;
            if (*(int *)((long)(bx->smallend).vect + lVar7) <=
                *(int *)((long)(this_00->smallend).vect + lVar7)) {
              uVar15 = *(undefined4 *)((long)pBVar4->bc + lVar7);
            }
            *(undefined4 *)
             ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start)->bc + lVar7) = uVar15;
            if (*(int *)((long)(this->domain).bigend.vect + lVar7) <=
                *(int *)((long)(bx->bigend).vect + lVar7)) {
              uVar12 = *(undefined4 *)((long)pBVar4->bc + lVar7 + 0xc);
            }
            *(undefined4 *)
             ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start)->bc + lVar7 + 0xc) = uVar12;
          }
          pBVar6 = StateDescriptor::bndryFill(this->desc,uVar11);
          (*pBVar6->_vptr_BndryFunc[5])(uVar19,pBVar6,bx,dest,(ulong)uVar3,1,geom,&bcr,0,uVar14);
          iVar18 = iVar18 + 1;
        }
        else {
          uVar5 = 0;
          if (0 < (int)uVar9) {
            uVar5 = (ulong)uVar9;
          }
          lVar7 = 0xc;
          for (uVar17 = 0; uVar17 != uVar5; uVar17 = uVar17 + 1) {
            pBVar4 = StateDescriptor::getBC(this->desc,uVar11 + (int)uVar17);
            for (lVar8 = -3; lVar8 != 0; lVar8 = lVar8 + 1) {
              iVar13 = 0;
              iVar16 = 0;
              if ((bx->bigend).vect[lVar8] <= (this->domain).bigend.vect[lVar8]) {
                iVar16 = pBVar4->bc[lVar8 + 3];
              }
              *(int *)((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              _M_impl.super__Vector_impl_data._M_start)->bc + lVar8 * 4 + lVar7) =
                   iVar16;
              if ((int)((IndexType *)(&(this->domain).bigend + 1))[lVar8].itype <=
                  (int)((IndexType *)(&bx->bigend + 1))[lVar8].itype) {
                iVar13 = pBVar4[1].bc[lVar8];
              }
              *(int *)((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              _M_impl.super__Vector_impl_data._M_start)->bc +
                      lVar8 * 4 + lVar7 + 0xc) = iVar13;
            }
            lVar7 = lVar7 + 0x18;
          }
          pBVar6 = StateDescriptor::bndryFill(this->desc,uVar11);
          (*pBVar6->_vptr_BndryFunc[5])
                    (uVar19,pBVar6,bx,dest,(ulong)uVar3,(ulong)uVar9,geom,&bcr,0,uVar14);
          iVar18 = uVar9 + iVar18;
        }
      }
    }
    std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
              ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bcr);
  }
  return;
}

Assistant:

void
StateData::FillBoundary (Box const&      bx,
                         FArrayBox&      dest,
                         Real            time,
                         const Geometry& geom,
                         int             dest_comp,
                         int             src_comp,
                         int             num_comp)
{
    BL_PROFILE("StateData::FillBoundary(geom)");

    if (domain.contains(convert(bx,domain.ixType()))) return;

    Vector<BCRec> bcr(num_comp);

    for (int i = 0; i < num_comp; )
    {
        const int dc  = dest_comp+i;
        const int sc  = src_comp+i;

        if (desc->primary(sc))
        {
            const int groupsize = desc->groupsize(sc);

            BL_ASSERT(groupsize != 0);

            if (groupsize+i <= num_comp)
            {
                for (int j = 0; j < groupsize; j++)
                {
                    amrex::setBC(bx,domain,desc->getBC(sc+j),bcr[j]);
                }
                //
                // Use the "group" boundary fill routine.
                //
                desc->bndryFill(sc)(bx,dest,dc,groupsize,geom,time,bcr,0,sc);
                i += groupsize;
            }
            else
            {
                amrex::setBC(bx,domain,desc->getBC(sc),bcr[0]);
                desc->bndryFill(sc)(bx,dest,dc,1,geom,time,bcr,0,sc);
                i++;
            }
        }
        else
        {
            amrex::setBC(bx,domain,desc->getBC(sc),bcr[0]);
            desc->bndryFill(sc)(bx,dest,dc,1,geom,time,bcr,0,sc);
            i++;
        }
    }
}